

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O0

void __thiscall CVmSrcfEntry::add_line_record(CVmSrcfEntry *this,ulong linenum,ulong code_addr)

{
  ulong in_RDX;
  CVmSrcfEntry *in_RSI;
  long in_RDI;
  
  if ((*(ulong *)(in_RDI + 0x18) < *(ulong *)(in_RDI + 0x20)) ||
     (alloc_line_records(in_RSI,in_RDX), *(ulong *)(in_RDI + 0x18) < *(ulong *)(in_RDI + 0x20))) {
    *(CVmSrcfEntry **)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x18) * 0x10) = in_RSI;
    *(ulong *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x18) * 0x10 + 8) = in_RDX;
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  }
  return;
}

Assistant:

void CVmSrcfEntry::add_line_record(ulong linenum, ulong code_addr)
{
    /* make sure we have enough space */
    if (lines_cnt_ >= lines_alo_)
    {
        /* expand the line records array */
        alloc_line_records(lines_alo_ + 1024);

        /* if that didn't create enough space, ignore the new record */
        if (lines_cnt_ >= lines_alo_)
            return;
    }

    /* add the new record */
    lines_[lines_cnt_].linenum = linenum;
    lines_[lines_cnt_].code_addr = code_addr;

    /* count the new record */
    ++lines_cnt_;
}